

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_misc.cpp
# Opt level: O0

void WritePNGfile(FileWriter *file,BYTE *buffer,PalEntry *palette,ESSType color_type,int width,
                 int height,int pitch)

{
  bool bVar1;
  char *pcVar2;
  char local_98 [8];
  char software [100];
  int height_local;
  int width_local;
  ESSType color_type_local;
  PalEntry *palette_local;
  BYTE *buffer_local;
  FileWriter *file_local;
  
  pcVar2 = GetVersionString();
  mysnprintf(local_98,100,"ZDoom %s",pcVar2);
  bVar1 = M_CreatePNG(file,buffer,palette,color_type,width,height,pitch);
  if (((!bVar1) || (bVar1 = M_AppendPNGText(file,"Software",local_98), !bVar1)) ||
     (bVar1 = M_FinishPNG(file), !bVar1)) {
    Printf("Could not create screenshot.\n");
  }
  return;
}

Assistant:

void WritePNGfile (FileWriter *file, const BYTE *buffer, const PalEntry *palette,
				   ESSType color_type, int width, int height, int pitch)
{
	char software[100];
	mysnprintf(software, countof(software), GAMENAME " %s", GetVersionString());
	if (!M_CreatePNG (file, buffer, palette, color_type, width, height, pitch) ||
		!M_AppendPNGText (file, "Software", software) ||
		!M_FinishPNG (file))
	{
		Printf ("Could not create screenshot.\n");
	}
}